

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

bool __thiscall jbcoin::STPathSet::isEquivalent(STPathSet *this,STBase *t)

{
  bool bVar1;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STPathSet_002f82c8) {
    return false;
  }
  bVar1 = std::operator==(&this->value,
                          (vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)(t + 1));
  return bVar1;
}

Assistant:

bool
STPathSet::isEquivalent (const STBase& t) const
{
    const STPathSet* v = dynamic_cast<const STPathSet*> (&t);
    return v && (value == v->value);
}